

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O0

void __thiscall duckdb::InMemoryLogStorage::FlushInternal(InMemoryLogStorage *this)

{
  pointer pDVar1;
  idx_t iVar2;
  pointer this_00;
  DataChunk *in_stack_00000040;
  DataChunk *in_stack_00000048;
  ColumnDataCollection *in_stack_00000050;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *in_stack_ffffffffffffffe0;
  
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )in_stack_ffffffffffffffe0);
  iVar2 = DataChunk::size(pDVar1);
  if (iVar2 != 0) {
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
    ::operator->(in_stack_ffffffffffffffe0);
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               in_stack_ffffffffffffffe0);
    ColumnDataCollection::Append(in_stack_00000050,in_stack_00000048);
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               in_stack_ffffffffffffffe0);
    DataChunk::Reset(in_stack_00000040);
  }
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )in_stack_ffffffffffffffe0);
  iVar2 = DataChunk::size(pDVar1);
  if (iVar2 != 0) {
    this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(in_stack_ffffffffffffffe0);
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               this_00);
    ColumnDataCollection::Append(in_stack_00000050,in_stack_00000048);
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               this_00);
    DataChunk::Reset(in_stack_00000040);
  }
  return;
}

Assistant:

void InMemoryLogStorage::FlushInternal() {
	if (entry_buffer->size() > 0) {
		log_entries->Append(*entry_buffer);
		entry_buffer->Reset();
	}

	if (log_context_buffer->size() > 0) {
		log_contexts->Append(*log_context_buffer);
		log_context_buffer->Reset();
	}
}